

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster_holder<Job,_std::shared_ptr<Job>_>::load
          (type_caster_holder<Job,_std::shared_ptr<Job>_> *this,handle src,bool convert,
          PyTypeObject *tobj)

{
  type_info *ptVar1;
  handle hVar2;
  pointer pp_Var3;
  pointer pp_Var4;
  unsigned_long uVar5;
  bool bVar6;
  int iVar7;
  internals *piVar8;
  const_iterator cVar9;
  iterator *self;
  pointer pp_Var10;
  iterator __begin5;
  tuple parents;
  iterator __end5;
  iterator local_68;
  object local_50;
  iterator local_48;
  
  ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
  if (ptVar1 != (type_info *)0x0 && src.m_ptr != (PyObject *)0x0) {
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      (this->super_type_caster_base<Job>).super_type_caster_generic.value = (void *)0x0;
      return true;
    }
    if (ptVar1->simple_type == true) {
      iVar7 = PyType_IsSubtype(tobj);
      if (iVar7 != 0) {
LAB_00110150:
        bVar6 = load_value_and_holder(this,src);
        return bVar6;
      }
      if (!convert) {
        return false;
      }
    }
    else {
      if (ptVar1->type == tobj) goto LAB_00110150;
      piVar8 = get_internals();
      uVar5 = ((tobj->ob_base).ob_base.ob_type)->tp_flags;
      local_68.super_object.super_handle.m_ptr = (handle)(handle)tobj;
      cVar9 = std::
              _Hashtable<const_void_*,_std::pair<const_void_*const,_void_*>,_std::allocator<std::pair<const_void_*const,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(piVar8->registered_types_py)._M_h,(key_type *)&local_68);
      if ((((int)uVar5 < 0) &&
          (cVar9.super__Node_iterator_base<std::pair<const_void_*const,_void_*>,_false>._M_cur ==
           (__node_type *)0x0)) && (hVar2.m_ptr = tobj->tp_bases, hVar2.m_ptr != (PyObject *)0x0)) {
        (hVar2.m_ptr)->ob_refcnt = (hVar2.m_ptr)->ob_refcnt + 1;
        local_50.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
        local_68.super_object.super_handle.m_ptr = (handle)PyObject_GetIter();
        local_68.ready = false;
        local_68.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_48.ready = false;
        local_48.super_object.super_handle.m_ptr = (handle)(PyObject *)0x0;
        local_48.value.super_handle.m_ptr = (handle)(PyObject *)0x0;
        while (bVar6 = iterator::operator!=(&local_68,&local_48), bVar6) {
          if ((local_68.ready == false) &&
             (local_68.super_object.super_handle.m_ptr != (PyObject *)0x0)) {
            iterator::advance(&local_68);
            local_68.ready = true;
          }
          bVar6 = load(this,src,convert,(PyTypeObject *)local_68.value.super_handle.m_ptr);
          if (bVar6) {
            object::~object(&local_48.value);
            object::~object(&local_48.super_object);
            object::~object(&local_68.value);
            object::~object(&local_68.super_object);
            object::~object(&local_50);
            return true;
          }
          if (local_68.super_object.super_handle.m_ptr != (PyObject *)0x0) {
            iterator::advance(&local_68);
          }
        }
        object::~object(&local_48.value);
        object::~object(&local_48.super_object);
        object::~object(&local_68.value);
        object::~object(&local_68.super_object);
        object::~object(&local_50);
      }
      bVar6 = try_implicit_casts<std::shared_ptr<Job>,_0>(this,src,convert);
      if (!convert || bVar6) {
        return bVar6;
      }
    }
    ptVar1 = (this->super_type_caster_base<Job>).super_type_caster_generic.typeinfo;
    pp_Var3 = (ptVar1->implicit_conversions).
              super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pp_Var4 = *(pointer *)
               ((long)&(ptVar1->implicit_conversions).
                       super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                       ._M_impl.super__Vector_impl_data + 8);
    if (pp_Var3 != pp_Var4) {
      do {
        pp_Var10 = pp_Var3 + 1;
        local_68.super_object.super_handle.m_ptr =
             (handle)(**pp_Var3)(src.m_ptr,
                                 ((this->super_type_caster_base<Job>).super_type_caster_generic.
                                 typeinfo)->type);
        object::operator=(&(this->super_type_caster_base<Job>).super_type_caster_generic.temp,
                          &local_68.super_object);
        object::~object(&local_68.super_object);
        bVar6 = load(this,(this->super_type_caster_base<Job>).super_type_caster_generic.temp.
                          super_handle.m_ptr,false);
        if (bVar6) {
          return bVar6;
        }
        pp_Var3 = pp_Var10;
      } while (pp_Var10 != pp_Var4);
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool load(handle src, bool convert, PyTypeObject *tobj) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            value = nullptr;
            return true;
        }

        if (typeinfo->simple_type) { /* Case 1: no multiple inheritance etc. involved */
            /* Check if we can safely perform a reinterpret-style cast */
            if (PyType_IsSubtype(tobj, typeinfo->type))
                return load_value_and_holder(src);
        } else { /* Case 2: multiple inheritance */
            /* Check if we can safely perform a reinterpret-style cast */
            if (tobj == typeinfo->type)
                return load_value_and_holder(src);

            /* If this is a python class, also check the parents recursively */
            auto const &type_dict = get_internals().registered_types_py;
            bool new_style_class = PyType_Check((PyObject *) tobj);
            if (type_dict.find(tobj) == type_dict.end() && new_style_class && tobj->tp_bases) {
                auto parents = reinterpret_borrow<tuple>(tobj->tp_bases);
                for (handle parent : parents) {
                    bool result = load(src, convert, (PyTypeObject *) parent.ptr());
                    if (result)
                        return true;
                }
            }

            if (try_implicit_casts(src, convert))
                return true;
        }

        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load(temp, false))
                    return true;
            }
        }

        return false;
    }